

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O1

void helper_crypto_sha1_3reg_aarch64(void *vd,void *vn,void *vm,uint32_t op)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  CRYPTO_STATE m;
  ulong local_10;
  ulong local_8;
  
  uVar1 = *vd;
  uVar4 = *(ulong *)((long)vd + 8);
  uVar3 = *vn;
  local_10 = *vm;
  local_8 = *(ulong *)((long)vm + 8);
  if (op < 3) {
    lVar2 = 0;
    do {
      uVar6 = (uint)uVar4;
      uVar5 = (uint)(uVar1 >> 0x20);
      uVar7 = (uint)(uVar4 >> 0x20);
      if (op == 1) {
        uVar7 = uVar7 ^ uVar5;
LAB_00610005:
        uVar6 = uVar6 ^ uVar7;
      }
      else {
        if (op == 0) {
          uVar6 = uVar5 & (uVar7 ^ uVar6);
          goto LAB_00610005;
        }
        uVar6 = (uVar5 | uVar6) & uVar7 | uVar6 & uVar5;
      }
      uVar1 = uVar1 << 0x20 |
              (ulong)((int)uVar3 + ((uint)uVar1 << 5 | (uint)uVar1 >> 0x1b) + uVar6 +
                     *(int *)((long)&local_10 + lVar2 * 4));
      uVar3 = uVar4 >> 0x20;
      uVar4 = uVar4 << 0x20 | (ulong)(uVar5 << 0x1e | uVar5 >> 2);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
  else {
    if (op != 3) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/crypto_helper.c"
                 ,0x104,(char *)0x0);
    }
    uVar1 = uVar1 ^ uVar4 ^ *vm;
    uVar4 = uVar3 ^ uVar4 ^ *(ulong *)((long)vm + 8);
  }
  *(ulong *)vd = uVar1;
  *(ulong *)((long)vd + 8) = uVar4;
  return;
}

Assistant:

void HELPER(crypto_sha1_3reg)(void *vd, void *vn, void *vm, uint32_t op)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    uint64_t *rm = vm;
    union CRYPTO_STATE d = { .l = { rd[0], rd[1] } };
    union CRYPTO_STATE n = { .l = { rn[0], rn[1] } };
    union CRYPTO_STATE m = { .l = { rm[0], rm[1] } };

    if (op == 3) { /* sha1su0 */
        d.l[0] ^= d.l[1] ^ m.l[0];
        d.l[1] ^= n.l[0] ^ m.l[1];
    } else {
        int i;

        for (i = 0; i < 4; i++) {
            uint32_t t = 0;

            switch (op) {
            case 0: /* sha1c */
                t = cho(CR_ST_WORD(d, 1), CR_ST_WORD(d, 2), CR_ST_WORD(d, 3));
                break;
            case 1: /* sha1p */
                t = par(CR_ST_WORD(d, 1), CR_ST_WORD(d, 2), CR_ST_WORD(d, 3));
                break;
            case 2: /* sha1m */
                t = maj(CR_ST_WORD(d, 1), CR_ST_WORD(d, 2), CR_ST_WORD(d, 3));
                break;
            default:
                g_assert_not_reached();
            }
            t += rol32(CR_ST_WORD(d, 0), 5) + CR_ST_WORD(n, 0)
                 + CR_ST_WORD(m, i);

            CR_ST_WORD(n, 0) = CR_ST_WORD(d, 3);
            CR_ST_WORD(d, 3) = CR_ST_WORD(d, 2);
            CR_ST_WORD(d, 2) = ror32(CR_ST_WORD(d, 1), 2);
            CR_ST_WORD(d, 1) = CR_ST_WORD(d, 0);
            CR_ST_WORD(d, 0) = t;
        }
    }
    rd[0] = d.l[0];
    rd[1] = d.l[1];
}